

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world.cpp
# Opt level: O0

void __thiscall World::World(World *this)

{
  vector<PointLight_*,_std::allocator<PointLight_*>_> *this_00;
  vector<SceneObject_*,_std::allocator<SceneObject_*>_> *this_01;
  ColorRGB local_28;
  ColorRGB local_1c;
  World *local_10;
  World *this_local;
  
  local_10 = this;
  ColorRGB::ColorRGB(&this->ambientColor);
  ColorRGB::ColorRGB(&this->backgroundColor);
  this_00 = (vector<PointLight_*,_std::allocator<PointLight_*>_> *)operator_new(0x18);
  memset(this_00,0,0x18);
  std::vector<PointLight_*,_std::allocator<PointLight_*>_>::vector(this_00);
  this->pointLights = this_00;
  this_01 = (vector<SceneObject_*,_std::allocator<SceneObject_*>_> *)operator_new(0x18);
  memset(this_01,0,0x18);
  std::vector<SceneObject_*,_std::allocator<SceneObject_*>_>::vector(this_01);
  this->sceneObjects = this_01;
  ColorRGB::ColorRGB(&local_1c,0.02,0.02,0.02);
  (this->ambientColor).r = local_1c.r;
  (this->ambientColor).g = local_1c.g;
  (this->ambientColor).b = local_1c.b;
  ColorRGB::ColorRGB(&local_28,0.1,0.1,0.1);
  (this->backgroundColor).r = local_28.r;
  (this->backgroundColor).g = local_28.g;
  (this->backgroundColor).b = local_28.b;
  this->backgroundEnabled = true;
  return;
}

Assistant:

World::World() {
    pointLights = new std::vector<PointLight*>();
    sceneObjects = new std::vector<SceneObject*>();
    ambientColor = ColorRGB(0.02, 0.02, 0.02);
    backgroundColor = ColorRGB(0.1, 0.1, 0.1);
    backgroundEnabled = true;
}